

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMessageCommand.cxx
# Opt level: O3

void anon_unknown.dwarf_16adde2::anon_unknown_0::WriteMessageEvent
               (cmConfigureLog *log,cmMakefile *mf,string *message)

{
  bool bVar1;
  int iVar2;
  string_view text;
  string_view key;
  initializer_list<unsigned_long> __l;
  allocator_type local_41;
  string local_40;
  
  if ((anonymous_namespace)::(anonymous_namespace)::
      WriteMessageEvent(cmConfigureLog&,cmMakefile_const&,std::__cxx11::string_const&)::
      LogVersionsWithMessageV1 == '\0') {
    iVar2 = __cxa_guard_acquire(&(anonymous_namespace)::(anonymous_namespace)::
                                 WriteMessageEvent(cmConfigureLog&,cmMakefile_const&,std::__cxx11::string_const&)
                                 ::LogVersionsWithMessageV1);
    if (iVar2 != 0) {
      local_40._M_dataplus._M_p = (pointer)0x1;
      __l._M_len = 1;
      __l._M_array = (iterator)&local_40;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                (&WriteMessageEvent::LogVersionsWithMessageV1,__l,&local_41);
      __cxa_atexit(std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector,
                   &WriteMessageEvent::LogVersionsWithMessageV1,&__dso_handle);
      __cxa_guard_release(&(anonymous_namespace)::(anonymous_namespace)::
                           WriteMessageEvent(cmConfigureLog&,cmMakefile_const&,std::__cxx11::string_const&)
                           ::LogVersionsWithMessageV1);
    }
  }
  bVar1 = cmConfigureLog::IsAnyLogVersionEnabled(log,&WriteMessageEvent::LogVersionsWithMessageV1);
  if (bVar1) {
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"message-v1","");
    cmConfigureLog::BeginEvent(log,&local_40,mf);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    }
    text._M_str = (message->_M_dataplus)._M_p;
    text._M_len = message->_M_string_length;
    key._M_str = "message";
    key._M_len = 7;
    cmConfigureLog::WriteLiteralTextBlock(log,key,text);
    cmConfigureLog::EndEvent(log);
  }
  return;
}

Assistant:

void WriteMessageEvent(cmConfigureLog& log, cmMakefile const& mf,
                       std::string const& message)
{
  // Keep in sync with cmFileAPIConfigureLog's DumpEventKindNames.
  static const std::vector<unsigned long> LogVersionsWithMessageV1{ 1 };

  if (log.IsAnyLogVersionEnabled(LogVersionsWithMessageV1)) {
    log.BeginEvent("message-v1", mf);
    log.WriteLiteralTextBlock("message"_s, message);
    log.EndEvent();
  }
}